

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O3

int queryStrItem(void *userData,char *queryItemKey,size_t queryItemKeyLen,char *queryItemValue,
                size_t queryItemValueLen)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  uint uVar3;
  IContext *pIVar4;
  undefined4 extraout_var;
  ExpressionResultBuilder *pEVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  mapped_type *this;
  undefined8 uVar6;
  char *pcVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  AssertionInfo __assertionInfo212;
  long *local_340;
  long local_338;
  long local_330 [2];
  string local_320;
  string local_300;
  char *local_2e0;
  AssertionInfo local_2d8;
  char *local_268;
  void *local_260;
  ExpressionResultBuilder local_258;
  
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  local_2e0 = queryItemValue;
  local_268 = queryItemKey;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"CAPTURE","");
  local_340 = local_330;
  local_260 = userData;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_340,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
             ,"");
  paVar1 = &local_258.m_data.reconstructedExpression.field_2;
  local_258.m_data.reconstructedExpression._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,local_340,local_338 + (long)local_340);
  local_258.m_data.message._M_dataplus._M_p = (pointer)0xd4;
  paVar8 = &local_300.field_2;
  local_300._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"");
  Catch::AssertionInfo::AssertionInfo
            (&local_2d8,&local_320,(SourceLineInfo *)&local_258,&local_300,ContinueOnFailure);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar8) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.m_data.reconstructedExpression._M_dataplus._M_p != paVar1) {
    operator_delete(local_258.m_data.reconstructedExpression._M_dataplus._M_p,
                    local_258.m_data.reconstructedExpression.field_2._M_allocated_capacity + 1);
  }
  if (local_340 != local_330) {
    operator_delete(local_340,local_330[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  pIVar4 = Catch::getCurrentContext();
  iVar2 = (*pIVar4->_vptr_IContext[2])(pIVar4);
  Catch::ExpressionResultBuilder::ExpressionResultBuilder(&local_258,Info);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258.m_stream,"queryItemKey := ",0x10);
  pEVar5 = Catch::ExpressionResultBuilder::operator<<(&local_258,&local_268);
  uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x40))
                    ((long *)CONCAT44(extraout_var,iVar2),pEVar5,&local_2d8);
  Catch::ExpressionResultBuilder::~ExpressionResultBuilder(&local_258);
  if ((uVar3 & 4) != 0) {
    uVar6 = __cxa_allocate_exception(1);
    __cxa_throw(uVar6,&Catch::TestFailureException::typeinfo,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8.capturedExpression._M_dataplus._M_p != &local_2d8.capturedExpression.field_2) {
    operator_delete(local_2d8.capturedExpression._M_dataplus._M_p,
                    local_2d8.capturedExpression.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8.lineInfo.file._M_dataplus._M_p != &local_2d8.lineInfo.file.field_2) {
    operator_delete(local_2d8.lineInfo.file._M_dataplus._M_p,
                    local_2d8.lineInfo.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8.macroName._M_dataplus._M_p != &local_2d8.macroName.field_2) {
    operator_delete(local_2d8.macroName._M_dataplus._M_p,
                    local_2d8.macroName.field_2._M_allocated_capacity + 1);
  }
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"CAPTURE","");
  local_340 = local_330;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_340,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
             ,"");
  local_258.m_data.reconstructedExpression._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,local_340,local_338 + (long)local_340);
  local_258.m_data.message._M_dataplus._M_p = (pointer)0xd5;
  local_300._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"");
  Catch::AssertionInfo::AssertionInfo
            (&local_2d8,&local_320,(SourceLineInfo *)&local_258,&local_300,ContinueOnFailure);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar8) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.m_data.reconstructedExpression._M_dataplus._M_p != paVar1) {
    operator_delete(local_258.m_data.reconstructedExpression._M_dataplus._M_p,
                    local_258.m_data.reconstructedExpression.field_2._M_allocated_capacity + 1);
  }
  if (local_340 != local_330) {
    operator_delete(local_340,local_330[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  pIVar4 = Catch::getCurrentContext();
  iVar2 = (*pIVar4->_vptr_IContext[2])(pIVar4);
  Catch::ExpressionResultBuilder::ExpressionResultBuilder(&local_258,Info);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_258.m_stream,"queryItemKeyLen := ",0x13);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_258.m_stream);
  uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x40))
                    ((long *)CONCAT44(extraout_var_00,iVar2),&local_258,&local_2d8);
  Catch::ExpressionResultBuilder::~ExpressionResultBuilder(&local_258);
  if ((uVar3 & 4) == 0) {
    paVar1 = &local_258.m_data.reconstructedExpression.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.capturedExpression._M_dataplus._M_p != &local_2d8.capturedExpression.field_2) {
      operator_delete(local_2d8.capturedExpression._M_dataplus._M_p,
                      local_2d8.capturedExpression.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.lineInfo.file._M_dataplus._M_p != &local_2d8.lineInfo.file.field_2) {
      operator_delete(local_2d8.lineInfo.file._M_dataplus._M_p,
                      local_2d8.lineInfo.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.macroName._M_dataplus._M_p != &local_2d8.macroName.field_2) {
      operator_delete(local_2d8.macroName._M_dataplus._M_p,
                      local_2d8.macroName.field_2._M_allocated_capacity + 1);
    }
    if (local_2e0 == (char *)0x0) {
      pcVar7 = (char *)0x0;
    }
    else {
      local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"CAPTURE","");
      local_340 = local_330;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_340,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
                 ,"");
      local_258.m_data.reconstructedExpression._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,local_340,local_338 + (long)local_340);
      local_258.m_data.message._M_dataplus._M_p = (pointer)0xd8;
      local_300._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"");
      Catch::AssertionInfo::AssertionInfo
                (&local_2d8,&local_320,(SourceLineInfo *)&local_258,&local_300,ContinueOnFailure);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != paVar8) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258.m_data.reconstructedExpression._M_dataplus._M_p != paVar1) {
        operator_delete(local_258.m_data.reconstructedExpression._M_dataplus._M_p,
                        local_258.m_data.reconstructedExpression.field_2._M_allocated_capacity + 1);
      }
      if (local_340 != local_330) {
        operator_delete(local_340,local_330[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
      }
      pIVar4 = Catch::getCurrentContext();
      iVar2 = (*pIVar4->_vptr_IContext[2])(pIVar4);
      Catch::ExpressionResultBuilder::ExpressionResultBuilder(&local_258,Info);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_258.m_stream,"queryItemValue := ",0x12);
      pEVar5 = Catch::ExpressionResultBuilder::operator<<(&local_258,&local_2e0);
      uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x40))
                        ((long *)CONCAT44(extraout_var_01,iVar2),pEVar5,&local_2d8);
      Catch::ExpressionResultBuilder::~ExpressionResultBuilder(&local_258);
      if ((uVar3 & 4) != 0) {
        uVar6 = __cxa_allocate_exception(1);
        __cxa_throw(uVar6,&Catch::TestFailureException::typeinfo,0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8.capturedExpression._M_dataplus._M_p != &local_2d8.capturedExpression.field_2)
      {
        operator_delete(local_2d8.capturedExpression._M_dataplus._M_p,
                        local_2d8.capturedExpression.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8.lineInfo.file._M_dataplus._M_p != &local_2d8.lineInfo.file.field_2) {
        operator_delete(local_2d8.lineInfo.file._M_dataplus._M_p,
                        local_2d8.lineInfo.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8.macroName._M_dataplus._M_p != &local_2d8.macroName.field_2) {
        operator_delete(local_2d8.macroName._M_dataplus._M_p,
                        local_2d8.macroName.field_2._M_allocated_capacity + 1);
      }
      local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"CAPTURE","");
      local_340 = local_330;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_340,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
                 ,"");
      local_258.m_data.reconstructedExpression._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,local_340,local_338 + (long)local_340);
      local_258.m_data.message._M_dataplus._M_p = (pointer)0xd9;
      local_300._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"");
      Catch::AssertionInfo::AssertionInfo
                (&local_2d8,&local_320,(SourceLineInfo *)&local_258,&local_300,ContinueOnFailure);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != paVar8) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258.m_data.reconstructedExpression._M_dataplus._M_p != paVar1) {
        operator_delete(local_258.m_data.reconstructedExpression._M_dataplus._M_p,
                        local_258.m_data.reconstructedExpression.field_2._M_allocated_capacity + 1);
      }
      if (local_340 != local_330) {
        operator_delete(local_340,local_330[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
      }
      pIVar4 = Catch::getCurrentContext();
      iVar2 = (*pIVar4->_vptr_IContext[2])(pIVar4);
      Catch::ExpressionResultBuilder::ExpressionResultBuilder(&local_258,Info);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_258.m_stream,"queryItemValueLen := ",0x15);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_258.m_stream);
      uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x40))
                        ((long *)CONCAT44(extraout_var_02,iVar2),&local_258,&local_2d8);
      Catch::ExpressionResultBuilder::~ExpressionResultBuilder(&local_258);
      if ((uVar3 & 4) != 0) {
        uVar6 = __cxa_allocate_exception(1);
        __cxa_throw(uVar6,&Catch::TestFailureException::typeinfo,0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8.capturedExpression._M_dataplus._M_p != &local_2d8.capturedExpression.field_2)
      {
        operator_delete(local_2d8.capturedExpression._M_dataplus._M_p,
                        local_2d8.capturedExpression.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8.lineInfo.file._M_dataplus._M_p != &local_2d8.lineInfo.file.field_2) {
        operator_delete(local_2d8.lineInfo.file._M_dataplus._M_p,
                        local_2d8.lineInfo.file.field_2._M_allocated_capacity + 1);
      }
      pcVar7 = local_2e0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8.macroName._M_dataplus._M_p != &local_2d8.macroName.field_2) {
        operator_delete(local_2d8.macroName._M_dataplus._M_p,
                        local_2d8.macroName.field_2._M_allocated_capacity + 1);
        pcVar7 = local_2e0;
      }
    }
    paVar8 = &local_258.m_data.reconstructedExpression.field_2;
    local_258.m_data.reconstructedExpression._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_258,pcVar7,pcVar7 + queryItemValueLen);
    local_2d8.macroName._M_dataplus._M_p = (pointer)&local_2d8.macroName.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2d8,local_268,local_268 + queryItemKeyLen);
    this = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)((long)local_260 + 0x120),&local_2d8.macroName);
    std::__cxx11::string::operator=((string *)this,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.macroName._M_dataplus._M_p != &local_2d8.macroName.field_2) {
      operator_delete(local_2d8.macroName._M_dataplus._M_p,
                      local_2d8.macroName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258.m_data.reconstructedExpression._M_dataplus._M_p != paVar8) {
      operator_delete(local_258.m_data.reconstructedExpression._M_dataplus._M_p,
                      local_258.m_data.reconstructedExpression.field_2._M_allocated_capacity + 1);
    }
    return 1;
  }
  uVar6 = __cxa_allocate_exception(1);
  __cxa_throw(uVar6,&Catch::TestFailureException::typeinfo,0);
}

Assistant:

inline int queryStrItem(void* userData, const char* queryItemKey, size_t queryItemKeyLen, const char* queryItemValue, size_t queryItemValueLen)
{
    CAPTURE(queryItemKey);
    CAPTURE(queryItemKeyLen);
    if (queryItemValue)
    {
        CAPTURE(queryItemValue);
        CAPTURE(queryItemValueLen);
    }
    static_cast<URI*>(userData)->queryStrItems[std::string(queryItemKey,queryItemKeyLen)] = std::string(queryItemValue, queryItemValueLen);
    return 1;
}